

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  bool bVar1;
  float *pfVar2;
  long *in_RSI;
  long in_RDI;
  Mat *this_00;
  float bottom_blob_int8_scale_1;
  float weight_data_int8_scale;
  float bottom_blob_int8_scale;
  Allocator *in_stack_fffffffffffffcf8;
  Mat *in_stack_fffffffffffffd00;
  Mat *m;
  Mat *in_stack_fffffffffffffd08;
  float fVar3;
  Mat *in_stack_fffffffffffffd10;
  Mat *this_01;
  Mat local_280;
  float local_23c;
  float local_1f4;
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [132];
  float local_12c;
  undefined1 local_128 [64];
  undefined1 local_e8 [64];
  undefined1 local_a8 [80];
  undefined1 local_58 [64];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_58,in_RSI,*(undefined4 *)(in_RDI + 0xec),0);
  Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  Mat::~Mat((Mat *)0x18d745);
  bVar1 = Mat::empty(in_stack_fffffffffffffd00);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xe8) != 0) {
      (**(code **)(*local_18 + 0x10))(local_a8,local_18,*(undefined4 *)(in_RDI + 0xb8),1);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Mat::~Mat((Mat *)0x18d7f7);
      bVar1 = Mat::empty(in_stack_fffffffffffffd00);
      if (bVar1) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xf4) == 1) {
      (**(code **)(*local_18 + 0x10))(local_e8,local_18,*(undefined4 *)(in_RDI + 0xf0),1);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Mat::~Mat((Mat *)0x18d8ab);
      (**(code **)(*local_18 + 0x10))(local_128,local_18,1);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Mat::~Mat((Mat *)0x18d8f5);
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x200),0);
      local_12c = *pfVar2;
      Mat::Mat(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               (size_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      fVar3 = (float)((ulong)in_stack_fffffffffffffd08 >> 0x20);
      Mat::~Mat((Mat *)0x18d969);
      Mat::fill(in_stack_fffffffffffffd10,fVar3);
    }
    else if (*(int *)(in_RDI + 0xf4) == 2) {
      (**(code **)(*local_18 + 0x10))(local_1b0,local_18,1);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Mat::~Mat((Mat *)0x18da56);
      (**(code **)(*local_18 + 0x10))(local_1f0,local_18,1);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Mat::~Mat((Mat *)0x18daa0);
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),0);
      local_1f4 = *pfVar2;
      Mat::Mat(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               (size_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      fVar3 = (float)((ulong)in_stack_fffffffffffffd08 >> 0x20);
      Mat::~Mat((Mat *)0x18db14);
      Mat::fill(in_stack_fffffffffffffd10,fVar3);
      this_00 = (Mat *)(in_RDI + 0x200);
      m = (Mat *)0x0;
      pfVar2 = Mat::operator[](this_00,0);
      local_23c = *pfVar2;
      this_01 = &local_280;
      Mat::Mat(this_01,(int)((ulong)this_00 >> 0x20),(size_t)m,in_stack_fffffffffffffcf8);
      Mat::operator=(this_00,m);
      fVar3 = (float)((ulong)this_00 >> 0x20);
      Mat::~Mat((Mat *)0x18dba2);
      Mat::fill(this_01,fVar3);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    return 0;
}